

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.hpp
# Opt level: O2

void __thiscall Gmres::gmres(Gmres *this,double *x,double *b_vec)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  uint16_t i;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int __numer;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  (**this->_vptr_Gmres)(this,this->v_mat,x);
  sub(this->v_mat,b_vec,this->v_mat,this->len);
  dVar21 = norm(this->v_mat,this->len);
  *this->rho_e_vec = dVar21;
  if (dVar21 < this->tol) {
    return;
  }
  iVar11 = (int)this->v_mat;
  div(iVar11,iVar11);
  iVar11 = 0xffff;
  uVar17 = 0;
  for (uVar19 = 0; uVar19 < this->k_max; uVar19 = uVar19 + 1) {
    iVar7 = (int)uVar19;
    uVar9 = iVar7 + 1;
    (**this->_vptr_Gmres)
              (this,this->v_mat + uVar9 * this->len,this->v_mat + (uint)this->len * iVar7);
    uVar1 = this->len;
    for (uVar10 = 0; uVar8 = (uint)(ushort)(uVar1 * (short)uVar9), (uVar10 & 0xffff) <= uVar19;
        uVar10 = uVar10 + 1) {
      uVar2 = this->k_max;
      uVar12 = (ulong)(((int)(short)this->len * uVar10 & 0xffff) << 3);
      dVar21 = dot((double *)((long)this->v_mat + uVar12),
                   (double *)((long)this->v_mat + (ulong)(uVar8 * 8)),this->len);
      this->h_mat[(uVar2 + 1) * iVar7 + uVar10 & 0xffff] = dVar21;
      mul(this->U_buf,(double *)(uVar12 + (long)this->v_mat),dVar21,this->len);
      pdVar18 = (double *)((ulong)(uVar8 * 8) + (long)this->v_mat);
      sub(pdVar18,pdVar18,this->U_buf,this->len);
    }
    uVar2 = this->k_max;
    dVar21 = norm((double *)((ulong)(uVar8 * 8) + (long)this->v_mat),this->len);
    this->h_mat[(uVar2 + 1) * iVar7 + uVar9 & 0xffff] = dVar21;
    if (ABS(dVar21) < 2.220446049250313e-16) {
      puts("Breakdown");
      return;
    }
    __numer = uVar8 * 8 + (int)this->v_mat;
    div(__numer,__numer);
    uVar2 = this->k_max;
    pdVar18 = this->h_mat;
    pdVar4 = this->g_vec;
    uVar10 = (uVar2 + 1) * iVar7;
    for (uVar12 = 0; uVar17 != uVar12; uVar12 = uVar12 + 3) {
      uVar14 = uVar12 & 0xffff;
      uVar15 = (ulong)(uVar10 & 0xffff);
      dVar21 = -(pdVar4[uVar14] * pdVar18[uVar15] + pdVar4[uVar14 + 1] * pdVar18[uVar15 + 1]) *
               pdVar4[uVar14 + 2];
      pdVar18[uVar15] = pdVar4[uVar14] * dVar21 + pdVar18[uVar15];
      pdVar18[uVar15 + 1] = dVar21 * pdVar4[uVar14 + 1] + pdVar18[uVar15 + 1];
      uVar10 = uVar10 + 1;
    }
    uVar14 = (ulong)((iVar7 * (uVar2 + 2) & 0xffff) << 3);
    dVar21 = *(double *)((long)pdVar18 + uVar14);
    dVar20 = norm((double *)((long)pdVar18 + uVar14),2);
    uVar12 = -(ulong)(dVar21 < 0.0);
    dVar20 = (double)(~uVar12 & (ulong)-dVar20 | uVar12 & (ulong)dVar20);
    pdVar18 = this->h_mat;
    pdVar4 = this->g_vec;
    uVar12 = (ulong)((iVar7 * 3 & 0xffffU) << 3);
    *(double *)((long)pdVar4 + uVar12) = *(double *)((long)pdVar18 + uVar14) - dVar20;
    *(undefined8 *)((long)pdVar4 + uVar12 + 8) = *(undefined8 *)((long)pdVar18 + uVar14 + 8);
    dVar21 = dot((double *)((long)pdVar4 + uVar12),(double *)((long)pdVar4 + uVar12),2);
    pdVar18 = this->g_vec;
    *(double *)((long)pdVar18 + uVar12 + 0x10) = 2.0 / dVar21;
    pdVar4 = this->h_mat;
    *(double *)((long)pdVar4 + uVar14) = dVar20;
    *(undefined8 *)((long)pdVar4 + uVar14 + 8) = 0;
    pdVar4 = this->rho_e_vec;
    dVar21 = -*(double *)((long)pdVar18 + uVar12) * pdVar4[uVar19] *
             *(double *)((long)pdVar18 + uVar12 + 0x10);
    pdVar4[uVar19] = *(double *)((long)pdVar18 + uVar12) * dVar21 + pdVar4[uVar19];
    dVar21 = dVar21 * *(double *)((long)pdVar18 + uVar12 + 8);
    pdVar4[uVar9] = dVar21;
    if (ABS(dVar21) < this->tol) break;
    iVar11 = iVar11 + 1;
    uVar17 = uVar17 + 3;
  }
  pdVar18 = this->h_mat;
  pdVar4 = this->rho_e_vec;
  uVar2 = this->k_max;
  lVar13 = (long)(short)iVar11;
  while( true ) {
    uVar3 = this->k_max;
    if (lVar13 < 0) break;
    pdVar5 = this->h_mat;
    pdVar6 = this->rho_e_vec;
    uVar9 = (uVar3 + 1) * iVar11 + (int)lVar13;
    for (lVar16 = (long)(short)iVar11; lVar13 < lVar16; lVar16 = lVar16 + -1) {
      uVar10 = uVar9 & 0xffff;
      uVar9 = uVar9 + ~(uint)uVar3;
      pdVar6[lVar13] = pdVar6[lVar13] - pdVar5[uVar10] * pdVar6[lVar16];
    }
    pdVar4[lVar13] = pdVar4[lVar13] / pdVar18[(uVar2 + 2) * (int)lVar13 & 0xffff];
    lVar13 = lVar13 + -1;
  }
  mul(this->v_mat + (ulong)uVar3 * (ulong)this->len,this->v_mat,this->rho_e_vec,this->len,
      (int16_t)uVar19);
  add(x,x,this->v_mat + (ulong)this->k_max * (ulong)this->len,this->len);
  return;
}

Assistant:

void gmres(double *x, const double *b_vec) {
    uint16_t k, idx_v1, idx_v2, idx_h, idx_g;
    double buf;

    // r0 = b - Ax(x0)
    Ax_func(&v_mat[0], x);
    sub(&v_mat[0], b_vec, &v_mat[0], len);

    // rho = sqrt(r0' * r0)
    rho_e_vec[0] = norm(&v_mat[0], len);

    if (rho_e_vec[0] < tol) {
      return;
    }

    // v(0) = r0 / rho
    div(&v_mat[0], &v_mat[0], rho_e_vec[0], len);

    for (k = 0; k < k_max; k++) {
      // v(k + 1) = Ax(v(k))
      Ax_func(&v_mat[len * (k + 1)], &v_mat[len * k]);

      idx_v1 = len * (k + 1);
      // Modified Gram-Schmidt
      for (uint16_t i = 0; i < k + 1; i++) {
        idx_v2 = len * i;
        idx_h = (k_max + 1) * k + i;
        h_mat[idx_h] = dot(&v_mat[idx_v2], &v_mat[idx_v1], len);
        mul(U_buf, &v_mat[idx_v2], h_mat[idx_h], len);
        sub(&v_mat[idx_v1], &v_mat[idx_v1], U_buf, len);
      }
      idx_h = (k_max + 1) * k + (k + 1);
      h_mat[idx_h] = norm(&v_mat[idx_v1], len);

      // Check breakdown
      if (fabs(h_mat[idx_h]) < DBL_EPSILON) {
        printf("Breakdown\n");
        return;
      } else {
        div(&v_mat[idx_v1], &v_mat[idx_v1], h_mat[idx_h], len);
      }

      // Transformation h_mat to upper triangular matrix by Householder transformation
      for (uint16_t i = 0; i < k; i++) {
        idx_h = (k_max + 1) * k + i;
        idx_g = g_vec_len * i;
        buf = (g_vec[idx_g + 0] * h_mat[idx_h + 0] + g_vec[idx_g + 1] * h_mat[idx_h + 1]) * g_vec[idx_g + 2];
        h_mat[idx_h + 0] = h_mat[idx_h + 0] - buf * g_vec[idx_g + 0];
        h_mat[idx_h + 1] = h_mat[idx_h + 1] - buf * g_vec[idx_g + 1];
      }
      idx_h = (k_max + 1) * k + k;
      idx_g = g_vec_len * k;
      buf = -sign(h_mat[idx_h]) * norm(&h_mat[idx_h], 2);  // Vector length
      g_vec[idx_g + 0] = h_mat[idx_h + 0] - buf;
      g_vec[idx_g + 1] = h_mat[idx_h + 1];
      g_vec[idx_g + 2] = 2.0 / dot(&g_vec[idx_g], &g_vec[idx_g], 2);
      h_mat[idx_h + 0] = buf;
      h_mat[idx_h + 1] = 0.0;

      // Update residual
      buf = g_vec[idx_g + 0] * rho_e_vec[k + 0] * g_vec[idx_g + 2];
      rho_e_vec[k + 0] = rho_e_vec[k + 0] - buf * g_vec[idx_g + 0];
      rho_e_vec[k + 1] = -buf * g_vec[idx_g + 1];

      // Check convergence
      if (fabs(rho_e_vec[k + 1]) < tol) {
        break;
      }
    }

    // Solve h_mat * y = rho_e_vec
    // h_mat is upper triangle matrix
    for (int16_t i = k - 1; i >= 0; i--) {
      for (int16_t j = k - 1; j > i; j--) {
        idx_h = (k_max + 1) * j + i;
        rho_e_vec[i] -= h_mat[idx_h] * rho_e_vec[j];
      }
      idx_h = (k_max + 1) * i + i;
      rho_e_vec[i] /= h_mat[idx_h];
    }

    // x = x + v_mat * y
    mul(&v_mat[len * k_max], v_mat, rho_e_vec, len, k);
    add(x, x, &v_mat[len * k_max], len);
  }